

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTextureOrNull
          (TextureParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  bool bVar1;
  size_t sVar2;
  const_reference pvVar3;
  int in_ECX;
  SpectrumHandle *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  in_RDI;
  TextureParameterDictionary *in_R8;
  float r;
  float g;
  SpectrumHandle s;
  RGB rgb;
  const_iterator iter;
  ParsedParameter *p;
  const_iterator __end1;
  const_iterator __begin1;
  ParsedParameterVector *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  polymorphic_allocator<std::byte> *in_stack_ffffffffffffff50;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  Allocator in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  float in_stack_ffffffffffffff9c;
  float local_60;
  float in_stack_ffffffffffffffa4;
  _Self local_58;
  _Self local_50;
  ParsedParameter *local_48;
  const_iterator local_40;
  const_iterator local_38;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *local_30;
  int local_24;
  SpectrumHandle *local_20;
  TextureParameterDictionary *local_10;
  
  local_30 = *(InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
               **)in_RSI;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_10 = in_R8;
  local_38 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::begin(local_30);
  local_40 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
             ::end(in_stack_ffffffffffffff40);
  do {
    if (local_38 == local_40) {
      SpectrumTextureHandle::TaggedPointer
                ((SpectrumTextureHandle *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )in_RDI.bits;
    }
    local_48 = *local_38;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if (bVar1) {
        bVar1 = pstd::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x751a88);
        if (bVar1) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78.bits,
                     in_RSI);
        }
        sVar2 = pstd::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_48->strings);
        if (sVar2 == 1) {
          local_48->lookedUp = true;
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_48->strings,0);
          local_50._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                       *)in_stack_ffffffffffffff38,(key_type *)0x751b24);
          local_58._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                      *)in_stack_ffffffffffffff38);
          bVar1 = std::operator!=(&local_50,&local_58);
          if (bVar1) {
            std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>
            ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>
                          *)0x751b5e);
            SpectrumTextureHandle::SpectrumTextureHandle
                      ((SpectrumTextureHandle *)in_stack_ffffffffffffff40,
                       (SpectrumTextureHandle *)in_stack_ffffffffffffff38);
            return (SpectrumTextureHandle)
                   (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                    )in_RDI.bits;
          }
          pstd::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_48->strings,0);
          ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((FileLoc *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (char *)in_stack_ffffffffffffff88.memoryResource,in_stack_ffffffffffffff80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff78.bits);
        }
        ErrorExit<std::__cxx11::string_const&>
                  ((FileLoc *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78.bits,
                   in_RSI);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if (bVar1) {
        sVar2 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size
                          (&local_48->numbers);
        if (sVar2 != 3) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78.bits,
                     in_RSI);
        }
        local_48->lookedUp = true;
        pvVar3 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                           (&local_48->numbers,0);
        r = (float)*pvVar3;
        pvVar3 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                           (&local_48->numbers,1);
        g = (float)*pvVar3;
        pvVar3 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::operator[]
                           (&local_48->numbers,2);
        RGB::RGB((RGB *)&stack0xffffffffffffff9c,r,g,(float)*pvVar3);
        if (((in_stack_ffffffffffffff9c < 0.0) || (local_60 < 0.0)) ||
           (in_stack_ffffffffffffffa4 < 0.0)) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78.bits,
                     in_RSI);
        }
        if (local_24 == 1) {
          ParameterDictionary::ColorSpace(*(ParameterDictionary **)in_RSI);
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::RGBConstantTexture,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                    (in_stack_ffffffffffffff50,(RGBColorSpace *)CONCAT44(g,r),
                     (RGB *)in_stack_ffffffffffffff40);
          SpectrumTextureHandle::TaggedPointer<pbrt::RGBConstantTexture>
                    ((SpectrumTextureHandle *)in_stack_ffffffffffffff40,
                     (RGBConstantTexture *)in_stack_ffffffffffffff38);
          return (SpectrumTextureHandle)
                 (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  )in_RDI.bits;
        }
        if (local_24 == 0) {
          ParameterDictionary::ColorSpace(*(ParameterDictionary **)in_RSI);
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::RGBReflectanceConstantTexture,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                    (in_stack_ffffffffffffff50,(RGBColorSpace *)CONCAT44(g,r),
                     (RGB *)in_stack_ffffffffffffff40);
          SpectrumTextureHandle::TaggedPointer<pbrt::RGBReflectanceConstantTexture>
                    ((SpectrumTextureHandle *)in_stack_ffffffffffffff40,
                     (RGBReflectanceConstantTexture *)in_stack_ffffffffffffff38);
          return (SpectrumTextureHandle)
                 (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  )in_RDI.bits;
        }
        LogFatal<char_const(&)[42]>
                  ((LogLevel)in_stack_ffffffffffffffa4,
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88.memoryResource,
                   (char (*) [42])in_stack_ffffffffffffff80);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38),
         bVar1)) {
        SpectrumHandle::TaggedPointer(local_20,in_stack_ffffffffffffff38);
        GetOneSpectrum(local_10,(string *)in_stack_ffffffffffffff78.bits,(SpectrumHandle *)in_RSI,
                       (SpectrumType)(in_RDI.bits >> 0x20),in_stack_ffffffffffffff88);
        TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
        ::TaggedPointer((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                         *)&stack0xffffffffffffff78,(nullptr_t)0x0);
        bVar1 = TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                ::operator!=((TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                              *)&stack0xffffffffffffff90,
                             (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                              *)&stack0xffffffffffffff78);
        if (bVar1) {
          pstd::pmr::polymorphic_allocator<std::byte>::
          new_object<pbrt::SpectrumConstantTexture,pbrt::SpectrumHandle&>
                    (in_stack_ffffffffffffff50,
                     (SpectrumHandle *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                    );
          SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumConstantTexture>
                    ((SpectrumTextureHandle *)local_20,
                     (SpectrumConstantTexture *)in_stack_ffffffffffffff38);
          return (SpectrumTextureHandle)
                 (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  )in_RDI.bits;
        }
        LogFatal<char_const(&)[13]>
                  ((LogLevel)in_stack_ffffffffffffffa4,
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   in_stack_ffffffffffffff94,(char *)in_stack_ffffffffffffff88.memoryResource,
                   (char (*) [13])local_10);
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTextureOrNull(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = spectrumTextures->find(p->strings[0]);
            if (iter != spectrumTextures->end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find spectrum texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "rgb") {
            if (p->numbers.size() != 3)
                ErrorExit(&p->loc,
                          "Didn't find three values for \"rgb\" parameter \"%s\".",
                          p->name);
            p->lookedUp = true;

            RGB rgb(p->numbers[0], p->numbers[1], p->numbers[2]);
            if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                ErrorExit(&p->loc,
                          "Negative value provided for \"rgb\" parameter \"%s\".",
                          p->name);
            if (spectrumType == SpectrumType::General)
                return alloc.new_object<RGBConstantTexture>(*dict->ColorSpace(), rgb);
            else {
                CHECK(spectrumType == SpectrumType::Reflectance);
                return alloc.new_object<RGBReflectanceConstantTexture>(
                    *dict->ColorSpace(), rgb);
            }
        } else if (p->type == "spectrum" || p->type == "blackbody") {
            SpectrumHandle s = GetOneSpectrum(name, nullptr, spectrumType, alloc);
            CHECK(s != nullptr);
            return alloc.new_object<SpectrumConstantTexture>(s);
        }
    }

    return nullptr;
}